

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxShift::Resolve(FxShift *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PString *pPVar2;
  PInt *pPVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxExpression *pFVar6;
  byte bVar7;
  FScriptPosition *pFVar8;
  uint uVar9;
  FString local_30;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  pFVar6 = (this->super_FxBinary).left;
  if (pFVar6 != (FxExpression *)0x0) {
    iVar5 = (*pFVar6->_vptr_FxExpression[2])(pFVar6,ctx);
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar5);
  }
  pFVar6 = (this->super_FxBinary).right;
  if (pFVar6 != (FxExpression *)0x0) {
    iVar5 = (*pFVar6->_vptr_FxExpression[2])(pFVar6,ctx);
    (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_00,iVar5);
    pFVar6 = (this->super_FxBinary).left;
    if (pFVar6 != (FxExpression *)0x0 &&
        (FxExpression *)CONCAT44(extraout_var_00,iVar5) != (FxExpression *)0x0) {
      iVar5 = (*(pFVar6->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
      if (((char)iVar5 == '\0') ||
         (iVar5 = (*(((this->super_FxBinary).right)->ValueType->super_PTypeBase).super_DObject.
                    _vptr_DObject[8])(), (char)iVar5 == '\0')) {
        pFVar6 = (FxExpression *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
                   "Incompatible operands for shift operation");
      }
      else {
        bVar4 = FxBinary::Promote(&this->super_FxBinary,ctx,true);
        if (!bVar4) {
          return (FxExpression *)0x0;
        }
        if (((this->super_FxBinary).super_FxExpression.ValueType == (PType *)TypeUInt32) &&
           ((this->super_FxBinary).Operator == 0x116)) {
          (this->super_FxBinary).Operator = 0x117;
        }
        iVar5 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
        if ((char)iVar5 == '\0') {
          return (FxExpression *)this;
        }
        iVar5 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])();
        if ((char)iVar5 == '\0') {
          return (FxExpression *)this;
        }
        pFVar6 = (this->super_FxBinary).left;
        pPVar2 = (PString *)pFVar6[1]._vptr_FxExpression;
        pFVar8 = &pFVar6[1].ScriptPosition;
        if (pPVar2 == TypeString) {
          FString::AttachToOther(&local_30,&pFVar8->FileName);
        }
        else {
          local_30.Chars = (pFVar8->FileName).Chars;
        }
        BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
        if (BVar1 == '\x01') {
          uVar9 = (uint)(double)local_30.Chars;
        }
        else {
          uVar9 = 0;
          if (BVar1 == '\0') {
            uVar9 = (uint)local_30.Chars;
          }
        }
        if (pPVar2 == TypeString) {
          FString::~FString(&local_30);
        }
        pFVar6 = (this->super_FxBinary).right;
        pPVar2 = (PString *)pFVar6[1]._vptr_FxExpression;
        pFVar8 = &pFVar6[1].ScriptPosition;
        if (pPVar2 == TypeString) {
          FString::AttachToOther(&local_30,&pFVar8->FileName);
        }
        else {
          local_30.Chars = (pFVar8->FileName).Chars;
        }
        BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
        if (BVar1 == '\x01') {
          bVar7 = (byte)(int)(double)local_30.Chars;
        }
        else {
          bVar7 = 0;
          if (BVar1 == '\0') {
            bVar7 = (byte)local_30.Chars;
          }
        }
        if (pPVar2 == TypeString) {
          FString::~FString(&local_30);
        }
        pFVar6 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
        iVar5 = (this->super_FxBinary).Operator;
        if (iVar5 == 0x116) {
          uVar9 = (int)uVar9 >> (bVar7 & 0x1f);
        }
        else if (iVar5 == 0x118) {
          uVar9 = uVar9 << (bVar7 & 0x1f);
        }
        else {
          uVar9 = uVar9 >> (bVar7 & 0x1f);
          if (iVar5 != 0x117) {
            uVar9 = 0;
          }
        }
        pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition
                  (&pFVar6->ScriptPosition,&(this->super_FxBinary).super_FxExpression.ScriptPosition
                  );
        pFVar6->NeedResult = true;
        pFVar6->ExprType = EFX_Constant;
        pFVar6->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
        pPVar3 = TypeSInt32;
        pFVar6[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
        pFVar6->ValueType = (PType *)pPVar3;
        *(uint *)&pFVar6[1].ScriptPosition.FileName.Chars = uVar9;
        pFVar6->isresolved = true;
      }
      (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
      return pFVar6;
    }
  }
  (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxShift::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->IsNumeric() && right->IsNumeric())
	{
		if (!Promote(ctx, true)) return nullptr;
		if (ValueType == TypeUInt32 && Operator == TK_RShift) Operator = TK_URShift;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operands for shift operation");
		delete this;
		return nullptr;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
		int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

		FxExpression *e = new FxConstant(
			Operator == TK_LShift ? v1 << v2 :
			Operator == TK_RShift ? v1 >> v2 :
			Operator == TK_URShift ? int((unsigned int)(v1) >> v2) : 0, ScriptPosition);

		delete this;
		return e;
	}
	return this;
}